

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O1

void __thiscall t_c_glib_generator::init_generator(t_c_glib_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  t_program *ptVar3;
  pointer pbVar4;
  size_type sVar5;
  int iVar6;
  int *piVar7;
  long *plVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  size_type *psVar11;
  long *plVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_include;
  pointer pptVar13;
  pointer pbVar14;
  string include_nspace_prefix;
  string f_types_impl_name;
  string program_name_u;
  string f_types_name;
  string program_name_lc;
  string program_name_uc;
  string local_230;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  string local_1d0;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  ofstream_with_content_based_conditional_update *local_190;
  t_c_glib_generator *local_188;
  string local_180;
  string local_160;
  string local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  pointer local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_1d0,this);
  iVar6 = mkdir(local_1d0._M_dataplus._M_p,0x1ff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((iVar6 == -1) && (piVar7 = __errno_location(), *piVar7 != 0x11)) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_180,this);
    std::__cxx11::string::string
              ((string *)&local_160,local_180._M_dataplus._M_p,(allocator *)&local_1b0);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
    local_1d0._M_dataplus._M_p = (pointer)*plVar8;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_1d0._M_dataplus._M_p == psVar11) {
      local_1d0.field_2._M_allocated_capacity = *psVar11;
      local_1d0.field_2._8_8_ = plVar8[3];
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *psVar11;
    }
    local_1d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    __rhs = strerror(*piVar7);
    std::operator+(__return_storage_ptr__,&local_1d0,__rhs);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  pcVar2 = (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,
             pcVar2 + (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length
            );
  initial_caps_to_underscores(&local_1d0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_1d0._M_dataplus._M_p,
             local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
  to_upper_case(&local_160,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_1d0._M_dataplus._M_p,
             local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
  to_lower_case(&local_180,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_210,this);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_210,(ulong)(this->nspace_lc)._M_dataplus._M_p);
  paVar1 = &local_230.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_230.field_2._M_allocated_capacity = *psVar11;
    local_230.field_2._8_8_ = plVar8[3];
    local_230._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar11;
    local_230._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_230._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)local_180._M_dataplus._M_p);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_1e0 = *plVar12;
    lStack_1d8 = plVar8[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar12;
    local_1f0 = (long *)*plVar8;
  }
  local_1e8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  local_1b0 = &local_1a0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_1a0 = *plVar12;
    lStack_198 = plVar8[3];
  }
  else {
    local_1a0 = *plVar12;
    local_1b0 = (long *)*plVar8;
  }
  local_1a8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  std::__cxx11::string::string((string *)&local_1f0,(char *)local_1b0,(allocator *)&local_230);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_types_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  this_00 = &this->f_types_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_types_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90
       = 0;
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_140,this);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_140,(ulong)(this->nspace_lc)._M_dataplus._M_p);
  local_210 = &local_200;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_200 = *plVar12;
    lStack_1f8 = plVar8[3];
  }
  else {
    local_200 = *plVar12;
    local_210 = (long *)*plVar8;
  }
  local_208 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_210,(ulong)local_180._M_dataplus._M_p);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_230.field_2._M_allocated_capacity = *psVar11;
    local_230.field_2._8_8_ = plVar8[3];
    local_230._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar11;
    local_230._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_230._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_230);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_1e0 = *plVar12;
    lStack_1d8 = plVar8[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar12;
    local_1f0 = (long *)*plVar8;
  }
  local_1e8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_230,(char *)local_1f0,(allocator *)&local_210);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_types_impl_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  local_190 = &this->f_types_impl_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (local_190);
  (this->f_types_impl_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_230._M_dataplus._M_p,local_230._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,local_230._M_dataplus._M_p,local_230._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#ifndef ",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,(this->nspace_uc)._M_dataplus._M_p,
                      (this->nspace_uc)._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_TYPES_H",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"#define ",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_TYPES_H",8);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"/* base includes */",0x13);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"#include <glib-object.h>",0x18);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"#include <thrift/c_glib/thrift_struct.h>",0x28);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"#include <thrift/c_glib/protocol/thrift_protocol.h>",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar3 = (this->super_t_oop_generator).super_t_generator.program_;
  local_188 = this;
  if ((ptVar3->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar3->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"/* other thrift includes */",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    pptVar13 = (ptVar3->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_118 = (ptVar3->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (pptVar13 != local_118) {
      local_120 = &local_b0.field_2;
      do {
        ptVar3 = *pptVar13;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"c_glib","");
        t_program::get_namespace(&local_230,ptVar3,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        sVar5 = local_230._M_string_length;
        if (local_230._M_string_length == 0) {
          local_210 = &local_200;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
        }
        else {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_230._M_dataplus._M_p,
                     local_230._M_dataplus._M_p + local_230._M_string_length);
          initial_caps_to_underscores(&local_140,&local_b0);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
          local_210 = &local_200;
          plVar8 = puVar10 + 2;
          if ((long *)*puVar10 == plVar8) {
            local_200 = *plVar8;
            lStack_1f8 = puVar10[3];
          }
          else {
            local_200 = *plVar8;
            local_210 = (long *)*puVar10;
          }
          local_208 = puVar10[1];
          *puVar10 = plVar8;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
        }
        if (sVar5 != 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include \"",10);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this_00,(char *)local_210,local_208);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        pcVar2 = (ptVar3->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar2,pcVar2 + (ptVar3->name_)._M_string_length);
        initial_caps_to_underscores(&local_d0,&local_f0);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types.h\"",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        pptVar13 = pptVar13 + 1;
      } while (pptVar13 != local_118);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
  }
  ptVar3 = (local_188->super_t_oop_generator).super_t_generator.program_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"/* custom thrift includes */",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  pbVar4 = (ptVar3->c_includes_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar14 = (ptVar3->c_includes_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar4; pbVar14 = pbVar14 + 1
      ) {
    if (*(pbVar14->_M_dataplus)._M_p == '<') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include ",9);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#include \"",10);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"#include <math.h>",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"#include \"",10);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(local_188->nspace_lc)._M_dataplus._M_p,
                      (local_188->nspace_lc)._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types.h\"",9);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"#include <thrift/c_glib/thrift.h>",0x21);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"/* begin types */",0x11);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_c_glib_generator::init_generator() {
  /* create output directory */
  MKDIR(get_out_dir().c_str());

  string program_name_u = initial_caps_to_underscores(program_name_);
  string program_name_uc = to_upper_case(program_name_u);
  string program_name_lc = to_lower_case(program_name_u);

  /* create output files */
  string f_types_name = get_out_dir() + this->nspace_lc + program_name_lc + "_types.h";
  f_types_.open(f_types_name.c_str());
  string f_types_impl_name = get_out_dir() + this->nspace_lc + program_name_lc + "_types.c";
  f_types_impl_.open(f_types_impl_name.c_str());

  /* add thrift boilerplate headers */
  f_types_ << autogen_comment();
  f_types_impl_ << autogen_comment();

  /* include inclusion guard */
  f_types_ << "#ifndef " << this->nspace_uc << program_name_uc << "_TYPES_H" << endl << "#define "
           << this->nspace_uc << program_name_uc << "_TYPES_H" << endl << endl;

  /* include base types */
  f_types_ << "/* base includes */" << endl << "#include <glib-object.h>" << endl
           << "#include <thrift/c_glib/thrift_struct.h>" << endl
           << "#include <thrift/c_glib/protocol/thrift_protocol.h>" << endl;

  /* include other thrift includes */
  const vector<t_program*>& includes = program_->get_includes();
  if (!includes.empty()) {
    f_types_ << "/* other thrift includes */" << endl;

    for (auto include : includes) {
      const std::string& include_nspace = include->get_namespace("c_glib");
      std::string include_nspace_prefix =
        include_nspace.empty() ? "" : initial_caps_to_underscores(include_nspace) + "_";

      f_types_ << "#include \"" << include_nspace_prefix
               << initial_caps_to_underscores(include->get_name()) << "_types.h\"" << endl;
    }
    f_types_ << endl;
  }

  /* include custom headers */
  const vector<string>& c_includes = program_->get_c_includes();
  f_types_ << "/* custom thrift includes */" << endl;
  for (const auto & c_include : c_includes) {
    if (c_include[0] == '<') {
      f_types_ << "#include " << c_include << endl;
    } else {
      f_types_ << "#include \"" << c_include << "\"" << endl;
    }
  }
  f_types_ << endl;

  /* include math.h (for "INFINITY") in the implementation file, in case we
     encounter a struct with a member of type double */
  f_types_impl_ << endl << "#include <math.h>" << endl;

  // include the types file
  f_types_impl_ << endl << "#include \"" << this->nspace_lc << program_name_u << "_types.h\""
                << endl << "#include <thrift/c_glib/thrift.h>" << endl << endl;

  f_types_ << "/* begin types */" << endl << endl;
}